

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef __thiscall llvm::ARM::computeDefaultTargetABI(ARM *this,Triple *TT,StringRef CPU)

{
  bool bVar1;
  ArchKind AK;
  OSType OVar2;
  ProfileKind PVar3;
  EnvironmentType EVar4;
  StringRef CPU_00;
  undefined1 local_d8 [8];
  StringRef ArchName;
  Triple *TT_local;
  StringRef CPU_local;
  
  CPU_00.Length = CPU.Data;
  if (CPU_00.Length == (char *)0x0) {
    _local_d8 = Triple::getArchName((Triple *)this);
  }
  else {
    CPU_00.Data = CPU_00.Length;
    AK = parseCPUArch((ARM *)TT,CPU_00);
    _local_d8 = getArchName(AK);
  }
  bVar1 = Triple::isOSBinFormatMachO((Triple *)this);
  if (bVar1) {
    EVar4 = Triple::getEnvironment((Triple *)this);
    if (((EVar4 == EABI) || (OVar2 = Triple::getOS((Triple *)this), OVar2 == UnknownOS)) ||
       (PVar3 = parseArchProfile(_local_d8), PVar3 == M)) {
      strlen("aapcs");
    }
    else {
      bVar1 = Triple::isWatchABI((Triple *)this);
      if (bVar1) {
        strlen("aapcs16");
      }
      else {
        strlen("apcs-gnu");
      }
    }
  }
  else {
    bVar1 = Triple::isOSWindows((Triple *)this);
    if (bVar1) {
      strlen("aapcs");
    }
    else {
      EVar4 = Triple::getEnvironment((Triple *)this);
      if (1 < EVar4 - GNUEABI) {
        if (EVar4 - EABI < 2) {
          strlen("aapcs");
          return stack0xffffffffffffff50;
        }
        if ((EVar4 != Android) && (EVar4 != MuslEABI && EVar4 != MuslEABIHF)) {
          bVar1 = Triple::isOSNetBSD((Triple *)this);
          if (bVar1) {
            strlen("apcs-gnu");
            return stack0xffffffffffffff50;
          }
          bVar1 = Triple::isOSOpenBSD((Triple *)this);
          if (!bVar1) {
            strlen("aapcs");
            return stack0xffffffffffffff50;
          }
          strlen("aapcs-linux");
          return stack0xffffffffffffff50;
        }
      }
      strlen("aapcs-linux");
    }
  }
  return stack0xffffffffffffff50;
}

Assistant:

StringRef llvm::ARM::computeDefaultTargetABI(const Triple &TT, StringRef CPU) {
  StringRef ArchName =
      CPU.empty() ? TT.getArchName() : ARM::getArchName(ARM::parseCPUArch(CPU));

  if (TT.isOSBinFormatMachO()) {
    if (TT.getEnvironment() == Triple::EABI ||
        TT.getOS() == Triple::UnknownOS ||
        llvm::ARM::parseArchProfile(ArchName) == ARM::ProfileKind::M)
      return "aapcs";
    if (TT.isWatchABI())
      return "aapcs16";
    return "apcs-gnu";
  } else if (TT.isOSWindows())
    // FIXME: this is invalid for WindowsCE.
    return "aapcs";

  // Select the default based on the platform.
  switch (TT.getEnvironment()) {
  case Triple::Android:
  case Triple::GNUEABI:
  case Triple::GNUEABIHF:
  case Triple::MuslEABI:
  case Triple::MuslEABIHF:
    return "aapcs-linux";
  case Triple::EABIHF:
  case Triple::EABI:
    return "aapcs";
  default:
    if (TT.isOSNetBSD())
      return "apcs-gnu";
    if (TT.isOSOpenBSD())
      return "aapcs-linux";
    return "aapcs";
  }
}